

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-emfile.c
# Opt level: O3

int run_test_emfile(void)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  sockaddr_in addr;
  rlimit limits;
  uv_connect_t connect_req;
  undefined1 auStack_98 [16];
  rlimit64 local_88;
  undefined1 local_78 [96];
  
  local_88.rlim_max = 0x20;
  local_88.rlim_cur = 0x20;
  iVar1 = setrlimit64(RLIMIT_NOFILE,&local_88);
  if (iVar1 == 0) {
    uVar3 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_98);
    if (iVar1 != 0) {
LAB_0014e63f:
      run_test_emfile_cold_3();
LAB_0014e644:
      run_test_emfile_cold_4();
LAB_0014e649:
      run_test_emfile_cold_5();
LAB_0014e64e:
      run_test_emfile_cold_6();
LAB_0014e653:
      run_test_emfile_cold_7();
      goto LAB_0014e658;
    }
    iVar1 = uv_tcp_init(uVar3,&server_handle);
    if (iVar1 != 0) goto LAB_0014e644;
    iVar1 = uv_tcp_init(uVar3,&client_handle);
    if (iVar1 != 0) goto LAB_0014e649;
    iVar1 = uv_tcp_bind(&server_handle,auStack_98,0);
    if (iVar1 != 0) goto LAB_0014e64e;
    iVar1 = uv_listen(&server_handle,8,connection_cb);
    if (iVar1 != 0) goto LAB_0014e653;
    do {
      iVar1 = dup(0);
      if (iVar1 != -1) goto LAB_0014e550;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    do {
      run_test_emfile_cold_13();
      iVar1 = extraout_EAX;
LAB_0014e550:
    } while (iVar1 < 1);
    do {
      do {
        iVar2 = dup(0);
      } while (iVar2 != -1);
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if (*piVar4 != 0x18) {
      run_test_emfile_cold_12();
      goto LAB_0014e63f;
    }
    close(0x1f);
    iVar2 = uv_tcp_connect(local_78,&client_handle,auStack_98,connect_cb);
    if (iVar2 != 0) goto LAB_0014e65d;
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0014e662;
    if (connect_cb_called == 1) {
      if (iVar1 < 0x1f) {
        do {
          close(iVar1);
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0x1f);
      }
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014e66c;
    }
  }
  else {
    piVar4 = __errno_location();
    if (*piVar4 == 1) {
      run_test_emfile_cold_2();
      return 1;
    }
LAB_0014e658:
    run_test_emfile_cold_1();
LAB_0014e65d:
    run_test_emfile_cold_8();
LAB_0014e662:
    run_test_emfile_cold_9();
  }
  run_test_emfile_cold_10();
LAB_0014e66c:
  run_test_emfile_cold_11();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
          ,0x67,"0 && \"connection_cb should not be called.\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(emfile) {
  struct sockaddr_in addr;
  struct rlimit limits;
  uv_connect_t connect_req;
  uv_loop_t* loop;
  int first_fd;
#if defined(_AIX) || defined(__MVS__)
  /* On AIX, if a 'accept' call fails ECONNRESET is set on the socket
   * which causes uv__emfile_trick to not work as intended and this test
   * to fail.
   */
  RETURN_SKIP("uv__emfile_trick does not work on this OS");
#endif

  /* Lower the file descriptor limit and use up all fds save one. */
  limits.rlim_cur = limits.rlim_max = maxfd + 1;
  if (setrlimit(RLIMIT_NOFILE, &limits)) {
    ASSERT(errno == EPERM);  /* Valgrind blocks the setrlimit() call. */
    RETURN_SKIP("setrlimit(RLIMIT_NOFILE) failed, running under valgrind?");
  }

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 8, connection_cb));

  /* Remember the first one so we can clean up afterwards. */
  do
    first_fd = dup(0);
  while (first_fd == -1 && errno == EINTR);
  ASSERT(first_fd > 0);

  while (dup(0) != -1 || errno == EINTR);
  ASSERT(errno == EMFILE);
  close(maxfd);

  /* Now connect and use up the last available file descriptor.  The EMFILE
   * handling logic in src/unix/stream.c should ensure that connect_cb() runs
   * whereas connection_cb() should *not* run.
   */
  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client_handle,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == connect_cb_called);

  /* Close the dups again. Ignore errors in the unlikely event that the
   * file descriptors were not contiguous.
   */
  while (first_fd < maxfd) {
    close(first_fd);
    first_fd += 1;
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}